

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O3

int64_t av1_interpolation_filter_search
                  (MACROBLOCK *x,AV1_COMP *cpi,TileDataEnc *tile_data,BLOCK_SIZE bsize,
                  BUFFER_SET *tmp_dst,BUFFER_SET *orig_dst,int64_t *rd,int *switchable_rate,
                  int *skip_build_pred,HandleInterModeArgs *args,int64_t ref_best_rd)

{
  MACROBLOCKD *xd;
  uint8_t uVar1;
  InterpFilter IVar2;
  TransformationType TVar3;
  COMPOUND_TYPE CVar4;
  undefined2 uVar5;
  BLOCK_SIZE bsize_00;
  MB_MODE_INFO *pMVar6;
  int64_t (*paaiVar7) [3] [8];
  MB_MODE_INFO *pMVar8;
  MB_MODE_INFO *pMVar9;
  bool bVar10;
  macroblockd_plane *pmVar11;
  BLOCK_SIZE bsize_01;
  uint8_t *puVar12;
  undefined4 uVar13;
  ushort uVar14;
  int iVar15;
  long lVar16;
  int *piVar17;
  buf_2d *pbVar18;
  int *piVar19;
  int64_t iVar20;
  byte bVar21;
  ushort uVar22;
  uint16_t uVar23;
  uint uVar24;
  uint uVar25;
  undefined7 in_register_00000009;
  long lVar26;
  scale_factors *psVar27;
  byte bVar28;
  uint uVar29;
  InterpFilters IVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  ulong uVar35;
  int *piVar36;
  uint uVar37;
  TileDataEnc *tile_data_00;
  InterpFilters IVar38;
  MB_MODE_INFO *pMVar39;
  uint uVar40;
  InterpFilters IVar41;
  ulong uVar42;
  undefined7 uVar45;
  long lVar43;
  undefined8 uVar44;
  int8_t *piVar46;
  uint uVar47;
  undefined1 *puVar48;
  long lVar49;
  BUFFER_SET **dst_bufs;
  BUFFER_SET **ppBVar50;
  int skip_pred;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  bool bVar55;
  bool bVar56;
  int in_stack_fffffffffffffe58;
  int local_158;
  int switchable_ctx [2];
  undefined8 local_128;
  uint8_t *puStack_120;
  uint8_t *puStack_118;
  ulong uStack_110;
  undefined8 local_108 [2];
  int *local_f8;
  undefined4 local_ec;
  BUFFER_SET *local_e8;
  BUFFER_SET *local_e0;
  RD_STATS local_d8;
  ulong local_b0;
  uint8_t *local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  byte local_90;
  long local_88;
  ulong local_80;
  undefined4 local_74;
  uint local_70;
  uint local_6c;
  MB_MODE_INFO **local_68;
  AV1_COMMON *local_60;
  BUFFER_SET *local_58;
  SequenceHeader *local_50;
  scale_factors *local_48;
  MB_MODE_INFO *local_40;
  macroblockd_plane *local_38;
  
  local_ec = (undefined4)CONCAT71(in_register_00000009,bsize);
  pMVar6 = *(x->e_mbd).mi;
  if (((*(ushort *)&pMVar6->field_0xa7 & 0x40) == 0) && (pMVar6->motion_mode != '\x02')) {
    bVar55 = true;
    if ((pMVar6->mode == '\x17') || (pMVar6->mode == '\x0f')) {
      bVar21 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
               [pMVar6->bsize];
      if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [pMVar6->bsize] <
          "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [pMVar6->bsize]) {
        bVar21 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [pMVar6->bsize];
      }
      if (bVar21 < 2) {
        bVar56 = false;
      }
      else {
        bVar56 = false;
        lVar16 = 0;
        do {
          TVar3 = (x->e_mbd).global_motion[pMVar6->ref_frame[lVar16]].wmtype;
          bVar55 = TVar3 == '\x01';
          if ((bVar55) || (pMVar6->ref_frame[1] < '\x01')) break;
          lVar16 = 1;
          bVar10 = !bVar56;
          bVar56 = true;
        } while (bVar10);
        bVar56 = TVar3 != '\x01';
      }
    }
    else {
      bVar56 = false;
    }
  }
  else {
    bVar55 = false;
    bVar56 = true;
  }
  uVar1 = ((cpi->common).seq_params)->monochrome;
  local_88 = (long)pMVar6->ref_frame[0];
  local_b0 = local_b0 & 0xffffffff00000000;
  local_a8 = (uint8_t *)0x0;
  uStack_a0 = 0;
  local_98 = 0;
  local_90 = 1;
  local_d8.rate = 0;
  local_d8.zero_rate = 0;
  local_d8.dist = 0;
  local_d8.rdcost = 0;
  local_d8.sse = 0;
  local_d8.skip_txfm = '\x01';
  IVar2 = (cpi->common).features.interp_filter;
  if (((0 < (long)args->interp_filter_stats_idx) && (bVar55)) &&
     (iVar15 = (cpi->sf).interp_sf.use_interp_filter, iVar15 != 0)) {
    bVar55 = '\0' < pMVar6->ref_frame[1];
    uVar35 = (ulong)bVar55;
    lVar16 = uVar35 + 1;
    piVar46 = args->interp_filter_stats[0].ref_frames;
    puVar48 = (undefined1 *)((long)args->interp_filter_stats[0].mv + 2);
    uVar42 = 0xffffffff;
    iVar34 = 0x7fffffff;
    uVar54 = 0;
    do {
      lVar49 = 0;
      do {
        if (piVar46[lVar49] != pMVar6->ref_frame[lVar49]) goto LAB_003c07cb;
        lVar49 = lVar49 + 1;
      } while (lVar16 != lVar49);
      if ((!bVar55 || iVar15 != 1) ||
         ((args->interp_filter_stats[uVar54].comp_type == (pMVar6->interinter_comp).type &&
          (args->interp_filter_stats[uVar54].compound_idx ==
           (*(ushort *)&pMVar6->field_0xa7 >> 9 & 1))))) {
        lVar49 = 0;
        iVar32 = 0;
        do {
          uVar51 = (int)*(short *)(puVar48 + lVar49 * 4 + -2) - (int)pMVar6->mv[lVar49].as_mv.row;
          uVar37 = -uVar51;
          if (0 < (int)uVar51) {
            uVar37 = uVar51;
          }
          uVar52 = (int)*(short *)(puVar48 + lVar49 * 4) -
                   (int)*(short *)((long)pMVar6->mv + lVar49 * 4 + 2);
          uVar51 = -uVar52;
          if (0 < (int)uVar52) {
            uVar51 = uVar52;
          }
          iVar32 = iVar32 + (uVar37 & 0xffff) + (uVar51 & 0xffff);
          lVar49 = lVar49 + 1;
        } while (lVar16 != lVar49);
        if (iVar32 == 0) {
          lVar16 = (long)(int)uVar54;
          pMVar6->interp_filters = args->interp_filter_stats[lVar16].filters;
          goto LAB_003c0c1e;
        }
        if ((iVar32 < iVar34) && (iVar32 <= *(int *)((long)iVar15 * 8 + 0x561728 + uVar35 * 4))) {
          uVar42 = uVar54 & 0xffffffff;
          iVar34 = iVar32;
        }
      }
LAB_003c07cb:
      uVar54 = uVar54 + 1;
      piVar46 = piVar46 + 0x28;
      puVar48 = puVar48 + 0x28;
    } while (uVar54 != (long)args->interp_filter_stats_idx);
    if ((int)uVar42 != -1) {
      lVar16 = (long)(int)uVar42;
      pMVar6->interp_filters = args->interp_filter_stats[lVar16].filters;
LAB_003c0c1e:
      *rd = args->interp_filter_stats[lVar16].rd;
      x->pred_sse[local_88] = args->interp_filter_stats[lVar16].pred_sse;
      *skip_build_pred = 0;
      return 0;
    }
  }
  xd = &x->e_mbd;
  uVar37 = (uint)IVar2;
  if (IVar2 == MULTITAP_SHARP2) {
    uVar37 = 0;
  }
  (pMVar6->interp_filters).as_int = uVar37 << 0x10 | uVar37;
  local_58 = tmp_dst;
  iVar15 = av1_get_pred_context_switchable_interp(xd,0);
  iVar34 = 0x3c0862;
  switchable_ctx[0] = iVar15;
  switchable_ctx[1] = av1_get_pred_context_switchable_interp(xd,1);
  iVar15 = (x->mode_costs).switchable_interp_costs[iVar15][(pMVar6->interp_filters).as_int & 0xff];
  if (((cpi->common).seq_params)->enable_dual_filter != '\0') {
    iVar15 = iVar15 + *(int *)((long)(x->mode_costs).switchable_interp_costs[switchable_ctx[1]] +
                              (ulong)((pMVar6->interp_filters).as_int >> 0xe & 0x3fc));
  }
  *switchable_rate = iVar15;
  local_128 = (uint8_t *)0x0;
  puStack_120 = (uint8_t *)0x0;
  puStack_118 = (uint8_t *)0x0;
  uStack_110 = 0;
  local_108[0]._0_1_ = 1;
  bsize_01 = (BLOCK_SIZE)local_ec;
  tile_data_00 = (TileDataEnc *)(ulong)(BLOCK_SIZE)local_ec;
  if (*skip_build_pred == 0) {
    iVar34 = 0;
    av1_enc_build_inter_predictor
              (&cpi->common,xd,(x->e_mbd).mi_row,(x->e_mbd).mi_col,orig_dst,(BLOCK_SIZE)local_ec,0,0
              );
  }
  uVar44 = 0;
  local_60 = &cpi->common;
  (*model_rd_sb_fn[(cpi->sf).rt_sf.use_simple_rd_model == 0])
            (cpi,bsize_01,x,xd,0,0,(int *)&local_128,(int64_t *)&puStack_120,(uint8_t *)local_108,
             (int64_t *)&uStack_110,(int *)0x0,(int64_t *)0x0,(int64_t *)0x0);
  iVar15 = (int)local_128;
  lVar16 = (long)(int)local_128;
  if (lVar16 == 0x7fffffff) {
    local_158 = 0;
    local_b0 = 0x7fffffff;
    local_a8 = (uint8_t *)0x7fffffffffffffff;
    uStack_a0 = 0x7fffffffffffffff;
    local_98 = 0x7fffffffffffffff;
    local_90 = 0;
    uVar35 = 0x7fffffffffffffff;
  }
  else {
    local_b0 = (ulong)local_128;
    local_a8 = puStack_120;
    local_158 = (int)((ulong)local_128 >> 0x20);
    if (uStack_110 == 0x7fffffffffffffff) {
      uStack_110 = 0;
    }
    else {
      local_98 = uStack_110;
    }
    local_90 = (byte)local_108[0] & 1;
    uVar35 = uStack_110;
  }
  bVar21 = local_90;
  puVar12 = local_a8;
  if (uVar1 == '\0') {
    local_128 = (uint8_t *)0x0;
    puStack_120 = (uint8_t *)0x0;
    puStack_118 = (uint8_t *)0x0;
    uStack_110 = 0;
    local_108[0] = CONCAT71(local_108[0]._1_7_,1);
    if (*skip_build_pred == 0) {
      iVar34 = 2;
      av1_enc_build_inter_predictor
                (local_60,xd,(x->e_mbd).mi_row,(x->e_mbd).mi_col,orig_dst,bsize_01,1,2);
    }
    uVar44 = 0;
    (*model_rd_sb_fn[(cpi->sf).rt_sf.use_simple_rd_model == 0])
              (cpi,bsize_01,x,xd,1,2,(int *)&local_128,(int64_t *)&puStack_120,(uint8_t *)local_108,
               (int64_t *)&uStack_110,(int *)0x0,(int64_t *)0x0,(int64_t *)0x0);
    lVar49 = (long)(int)local_128;
    uVar45 = (undefined7)((ulong)uVar44 >> 8);
    if (lVar49 != 0x7fffffff) {
      local_d8._0_8_ = (ulong)local_128._4_4_ << 0x20;
      if (uStack_110 == 0x7fffffffffffffff) {
        uStack_110 = 0;
      }
      else {
        local_d8.sse = uStack_110;
      }
      local_108[0]._0_1_ = (byte)local_108[0] & 1;
      bVar55 = local_128._4_4_ == 0;
      goto LAB_003c0ce3;
    }
    *skip_build_pred = 1;
    lVar43 = CONCAT71(uVar45,IVar2);
LAB_003c0cfb:
    local_d8.rate = 0x7fffffff;
    local_d8.zero_rate = 0;
    local_d8.dist = 0x7fffffffffffffff;
    local_d8.rdcost = 0x7fffffffffffffff;
    local_d8.sse = 0x7fffffffffffffff;
    local_d8.skip_txfm = 0;
    iVar15 = 0x7fffffff;
    lVar16 = -0x80;
  }
  else {
    lVar49 = 0;
    bVar55 = true;
    puStack_120 = (uint8_t *)0x0;
    uStack_110 = 0;
    local_108[0]._0_1_ = 1;
    uVar45 = (undefined7)((ulong)uVar44 >> 8);
LAB_003c0ce3:
    lVar43 = CONCAT71(uVar45,IVar2);
    *skip_build_pred = 1;
    if (iVar15 == 0x7fffffff) goto LAB_003c0cfb;
    lVar49 = lVar49 + lVar16;
    if (0x7ffffffe < lVar49) {
      lVar49 = 0x7fffffff;
    }
    iVar15 = (int)lVar49;
    if (bVar55) {
      local_d8.zero_rate = local_158;
    }
    local_d8.rate = iVar15;
    local_d8.dist = (int64_t)(puStack_120 + (long)puVar12);
    if (uVar35 != 0x7fffffffffffffff) {
      local_d8.sse = uStack_110 + uVar35;
    }
    local_d8.skip_txfm = (byte)local_108[0] & bVar21;
    lVar16 = (long)(puStack_120 + (long)puVar12) * 0x80;
  }
  lVar16 = ((long)x->rdmult * ((long)iVar15 + (long)*switchable_rate) + 0x100 >> 9) + lVar16;
  *rd = lVar16;
  x->pred_sse[local_88] = (uint)(uVar35 >> 4);
  if (bVar56 || (char)lVar43 != '\x04') {
    return 0;
  }
  paaiVar7 = args->modelled_rd;
  if ((paaiVar7 != (int64_t (*) [3] [8])0x0) && (0 < (long)pMVar6->ref_frame[1])) {
    lVar43 = (long)pMVar6->ref_frame[0];
    uVar37 = (*(ushort *)&pMVar6->field_0xa7 & 0x30) << 2;
    lVar49 = *(long *)((long)(*paaiVar7)[0] +
                      lVar43 * 8 +
                      (ulong)((uint)(byte)compound_ref0_mode_lut[pMVar6->mode] * 0xc0) +
                      (ulong)uVar37);
    lVar26 = *(long *)((long)(*paaiVar7)[0] +
                      (long)pMVar6->ref_frame[1] * 8 +
                      (ulong)((uint)(byte)compound_ref1_mode_lut[pMVar6->mode] * 0xc0) +
                      (ulong)uVar37);
    if (lVar49 < lVar26) {
      lVar26 = lVar49;
    }
    if ((ref_best_rd != 0x7fffffffffffffff) && (lVar26 < lVar16 >> 1)) {
      return 0x7fffffffffffffff;
    }
  }
  x->recalc_luma_mc_data = 0;
  uVar37 = (cpi->interp_search_flags).default_interp_skip_flags;
  piVar19 = (int *)(ulong)uVar37;
  local_68 = (x->e_mbd).mi;
  local_40 = *local_68;
  local_50 = (cpi->common).seq_params;
  local_48 = (cpi->common).ref_scale_factors;
  local_38 = (x->e_mbd).plane;
  uVar44 = CONCAT71((int7)((ulong)lVar43 >> 8),1);
  lVar16 = 0;
  local_f8 = piVar19;
  pMVar39 = local_40;
  uVar51 = uVar37;
  do {
    local_6c = uVar37;
    if (((byte)(pMVar39->ref_frame[lVar16] - 1U) < 8) &&
       (iVar15 = (cpi->common).remapped_ref_idx[(byte)pMVar39->ref_frame[lVar16] - 1], iVar15 != -1)
       ) {
      psVar27 = local_48 + iVar15;
    }
    else {
      psVar27 = (scale_factors *)0x0;
    }
    if ((psVar27->x_scale_fp != -1) && (psVar27->y_scale_fp != -1)) {
      piVar36 = (int *)0x0;
      bVar55 = true;
      if (psVar27->x_scale_fp != 0x4000) {
        uVar52 = 0;
        goto LAB_003c1103;
      }
      uVar52 = 0;
      if (psVar27->y_scale_fp != 0x4000) goto LAB_003c1103;
    }
    local_74 = (int)uVar44;
    uVar13 = local_74;
    local_70 = uVar51;
    iVar15 = (x->e_mbd).mb_to_bottom_edge;
    local_80 = CONCAT44(local_80._4_4_,iVar15);
    lVar49 = 0;
    uVar52 = 0;
    uVar53 = 0;
    bVar55 = true;
    do {
      bVar56 = bVar55;
      bVar28 = 1 - (char)(x->e_mbd).plane[lVar49].subsampling_y;
      bVar21 = 1 - (char)(x->e_mbd).plane[lVar49].subsampling_x;
      uVar40 = (x->e_mbd).mb_to_left_edge << (bVar21 & 0x1f);
      uVar25 = (uint)(x->e_mbd).plane[lVar49].width;
      uVar31 = (uint)(x->e_mbd).plane[lVar49].height;
      uVar33 = uVar25 * 0x10 + ((x->e_mbd).mb_to_right_edge << (bVar21 & 0x1f)) + 0x30;
      uVar47 = (x->e_mbd).mb_to_top_edge << (bVar28 & 0x1f);
      uVar24 = (uint)(short)((pMVar39->mv[lVar16].as_int >> 0x10) << (bVar21 & 0x1f));
      if ((int)uVar24 < (int)uVar33) {
        uVar33 = uVar24;
      }
      uVar29 = uVar31 * 0x10 + 0x30 + (iVar15 << (bVar28 & 0x1f));
      if ((int)uVar24 < (int)(uVar40 + uVar25 * -0x10 + -0x40)) {
        uVar33 = uVar40;
      }
      uVar25 = (uint)(short)(pMVar39->mv[lVar16].as_int << (bVar28 & 0x1f));
      if ((int)uVar25 < (int)uVar29) {
        uVar29 = uVar25;
      }
      if ((int)uVar25 < (int)(uVar47 + uVar31 * -0x10 + -0x40)) {
        uVar29 = uVar47;
      }
      uVar52 = (uint)((uVar33 & 0xf) == 0) << (sbyte)lVar49 | uVar52;
      uVar53 = (uint)((uVar29 & 0xf) == 0) << (sbyte)lVar49 | uVar53;
      if (local_50->monochrome != '\0') break;
      lVar49 = 1;
      bVar55 = false;
    } while (bVar56);
    uVar37 = uVar37 & uVar52;
    uVar51 = uVar51 & uVar53;
    lVar16 = 1;
    local_74._0_1_ = (byte)uVar44;
    bVar21 = (byte)local_74 & '\0' < local_40->ref_frame[1];
    uVar44 = 0;
    pMVar39 = local_40;
    local_74 = uVar13;
  } while (bVar21 != 0);
  bVar55 = uVar51 != 1;
  piVar36 = (int *)(ulong)uVar51;
  pMVar39 = local_40;
  uVar52 = uVar37;
LAB_003c1103:
  piVar17 = piVar36;
  if (('\0' < local_40->ref_frame[1]) && ((pMVar39->field_0xa8 & 2) != 0)) {
    piVar17 = (int *)0x0;
    if (bVar55) {
      piVar17 = piVar36;
    }
    if (uVar52 != 0) {
      piVar17 = piVar36;
    }
    if ((pMVar39->interinter_comp).type != '\x03') {
      piVar17 = piVar36;
    }
  }
  local_108[0] = *(undefined8 *)(local_58->stride + 2);
  puStack_118 = local_58->plane[2];
  uStack_110 = *(ulong *)local_58->stride;
  local_128 = local_58->plane[0];
  puStack_120 = local_58->plane[1];
  lVar16 = (ulong)(uVar1 == '\0') * 2 + 1;
  pmVar11 = (x->e_mbd).plane;
  lVar49 = 0;
  do {
    pbVar18 = &pmVar11->dst;
    pbVar18->buf = (uint8_t *)(&local_128)[lVar49];
    pbVar18->stride = *(int *)((long)local_108 + lVar49 * 4 + -8);
    lVar49 = lVar49 + 1;
    pmVar11 = (macroblockd_plane *)(pbVar18 + 0x51);
  } while (lVar16 != lVar49);
  local_e8 = local_58;
  local_e0 = orig_dst;
  bsize_00 = (BLOCK_SIZE)orig_dst;
  uVar37 = (uint)piVar17;
  if (local_50->enable_dual_filter == '\0') {
    pMVar39 = *local_68;
    uVar51 = (uint)(cpi->interp_search_flags).interp_filter_search_mask;
    if ((cpi->sf).interp_sf.adaptive_interp_filter_search == 2) {
      local_80 = (ulong)(cpi->ppi->gf_group).update_type[cpi->gf_frame_index];
      lVar49 = 0;
      iVar15 = av1_get_pred_context_switchable_interp(xd,0);
      iVar34 = 0x3c13a8;
      iVar32 = av1_get_pred_context_switchable_interp(xd,1);
      do {
        if ((*(int *)((long)(cpi->ppi->frame_probs).switchable_interp_probs[0][iVar15] +
                     lVar49 + (ulong)(uint)((int)local_80 * 0xc0)) <
             *(int *)(find_best_non_dual_interp_filter_thr + local_80 * 4)) &&
           (*(int *)((long)(cpi->ppi->frame_probs).switchable_interp_probs[0][iVar32] +
                    lVar49 + (ulong)(uint)((int)local_80 * 0xc0)) <
            *(int *)(find_best_non_dual_interp_filter_thr + local_80 * 4))) {
          uVar51 = uVar51 & (1 << ((byte)lVar49 & 0x1f) & 0x111U ^ 0x1ff);
        }
        lVar49 = lVar49 + 4;
      } while (lVar49 != 0xc);
      piVar19 = (int *)(ulong)(uint)(cpi->interp_search_flags).default_interp_skip_flags;
    }
    uVar33 = uVar37 & uVar52;
    piVar36 = (int *)(ulong)uVar33;
    local_f8 = piVar19;
    uVar53 = (uint)piVar19;
    if (uVar33 != uVar53) {
      pMVar9 = (x->e_mbd).left_mbmi;
      pMVar8 = (x->e_mbd).above_mbmi;
      uVar22 = 0xff;
      uVar14 = 0xff;
      IVar30.y_filter = 0xff;
      IVar30.x_filter = 0;
      if (pMVar8 != (MB_MODE_INFO *)0x0) {
        if ((pMVar8->field_0xa7 & 0x80) == 0) {
          uVar14 = 0xff;
          IVar30.y_filter = 0xff;
          IVar30.x_filter = 0;
          if (pMVar8->ref_frame[0] < '\x01') goto LAB_003c1482;
        }
        IVar30 = (pMVar8->interp_filters).as_filters;
        uVar14 = IVar30.x_filter;
      }
LAB_003c1482:
      if (pMVar9 == (MB_MODE_INFO *)0x0) {
        IVar38.y_filter = 0xff;
        IVar38.x_filter = 0;
      }
      else if (((pMVar9->field_0xa7 & 0x80) != 0) ||
              (IVar38.y_filter = 0xff, IVar38.x_filter = 0, '\0' < pMVar9->ref_frame[0])) {
        IVar38 = (pMVar9->interp_filters).as_filters;
        uVar22 = IVar38.x_filter;
      }
      bVar55 = ((uint)IVar30 & 0xffff) != 0xff;
      bVar56 = IVar30.y_filter == IVar38.y_filter;
      uVar25 = 0;
      if ((cpi->sf).interp_sf.cb_pred_filter_search != 0) {
        uVar25 = ((uint)((x->e_mbd).mi_row + (x->e_mbd).mi_col) >>
                 ((byte)tile_data_00[0xec].tctx.intra_ext_tx_cdf[2][2][5][8] & 0x1f)) +
                 (cpi->common).current_frame.frame_number & 1;
      }
      uVar31 = 0;
      if (bVar56 && bVar55) {
        uVar31 = uVar25;
      }
      if (uVar14 == uVar22 && uVar14 != 0xff) {
        uVar31 = uVar25;
      }
      if ((bVar56 && bVar55 || uVar14 == uVar22 && uVar14 != 0xff) && uVar31 != 0) {
        if ((((cpi->sf).interp_sf.adaptive_interp_filter_search == 0) ||
            ((uVar51 >> ((uint)(BUFFER_SET **)((ulong)uVar14 << 2) & 0x1c) & 1) != 0)) &&
           (uVar14 != 0)) {
          interpolation_filter_rd
                    (x,cpi,tile_data_00,bsize_00,(BUFFER_SET *)rd,(int64_t *)&local_b0,&local_d8,
                     (RD_STATS *)switchable_rate,(int *)&local_e8,
                     (BUFFER_SET **)((ulong)uVar14 << 2),(int)switchable_ctx,piVar36,
                     in_stack_fffffffffffffe58);
        }
        goto LAB_003c1690;
      }
    }
    if ((((BLOCK_SIZE)local_ec != '\0') &&
        (((0x10003UL >> ((ulong)tile_data_00 & 0x3f) & 1) == 0 || (uVar53 != uVar37)))) &&
       (((0x20005UL >> ((ulong)tile_data_00 & 0x3f) & 1) == 0 || (uVar53 != uVar52)))) {
      ppBVar50 = (BUFFER_SET **)&DAT_00000004;
      while ((((uVar37 = (uint)ppBVar50, (cpi->sf).interp_sf.adaptive_interp_filter_search != 0 &&
               ((uVar51 >> (uVar37 & 0x1f) & 1) == 0)) ||
              ((interpolation_filter_rd
                          (x,cpi,tile_data_00,bsize_00,(BUFFER_SET *)rd,(int64_t *)&local_b0,
                           &local_d8,(RD_STATS *)switchable_rate,(int *)&local_e8,ppBVar50,
                           (int)switchable_ctx,piVar36,in_stack_fffffffffffffe58),
               (cpi->sf).interp_sf.skip_sharp_interp_filter_search == 0 ||
               ((uVar33 == (cpi->interp_search_flags).default_interp_skip_flags ||
                ((pMVar39->interp_filters).as_int != 0x10001)))))) && (uVar37 < 5))) {
        ppBVar50 = (BUFFER_SET **)(ulong)(uVar37 + 4);
      }
      goto LAB_003c1690;
    }
    uVar37 = uVar51 & 0x110;
    if ((cpi->sf).interp_sf.adaptive_interp_filter_search == 0) {
      uVar37 = 0x110;
    }
    uVar23 = 1;
  }
  else {
    if ((cpi->sf).interp_sf.use_fast_interpolation_filter_search != 0) {
      if ((0x18 < (*local_68)->mode) || ((0x1790000U >> ((*local_68)->mode & 0x1f) & 1) == 0)) {
        pMVar39 = (x->e_mbd).left_mbmi;
        pMVar9 = (x->e_mbd).above_mbmi;
        uVar23 = 0xff;
        uVar53 = 0xff;
        uVar51 = 0xff;
        if (pMVar9 != (MB_MODE_INFO *)0x0) {
          if ((pMVar9->field_0xa7 & 0x80) == 0) {
            uVar53 = 0xff;
            uVar51 = 0xff;
            if (pMVar9->ref_frame[0] < '\x01') goto LAB_003c182e;
          }
          uVar51 = (pMVar9->interp_filters).as_int;
          uVar53 = uVar51 >> 0x10;
        }
LAB_003c182e:
        if (pMVar39 == (MB_MODE_INFO *)0x0) {
          IVar41.y_filter = 0xff;
          IVar41.x_filter = 0;
        }
        else if (((pMVar39->field_0xa7 & 0x80) != 0) ||
                (IVar41.y_filter = 0xff, IVar41.x_filter = 0, '\0' < pMVar39->ref_frame[0])) {
          IVar41 = (pMVar39->interp_filters).as_filters;
          uVar23 = IVar41.x_filter;
        }
        bVar55 = (uint16_t)uVar53 == uVar23;
        uVar33 = uVar51 & 0xffff;
        bVar56 = (uint16_t)uVar51 == IVar41.y_filter;
        uVar25 = 0;
        if ((cpi->sf).interp_sf.cb_pred_filter_search != 0) {
          uVar25 = ((uint)((x->e_mbd).mi_row + (x->e_mbd).mi_col) >>
                   ((byte)tile_data_00[0xec].tctx.intra_ext_tx_cdf[2][2][5][8] & 0x1f)) +
                   (cpi->common).current_frame.frame_number & 1;
        }
        uVar31 = 0;
        if (bVar56 && uVar33 != 0xff) {
          uVar31 = uVar25;
        }
        if (bVar55 && uVar53 != 0xff) {
          uVar31 = uVar25;
        }
        iVar15 = uVar31 * ((uint)(bVar55 && uVar53 != 0xff) + (uint)(bVar56 && uVar33 != 0xff) * 2);
        if (iVar15 != 0) {
          piVar36 = (int *)(ulong)(uVar37 & uVar52);
          if (iVar15 == 2) {
            uVar37 = (uint)av1_interp_dual_filt_mask[1][uVar33];
          }
          else if (iVar15 == 1) {
            uVar37 = (uint)av1_interp_dual_filt_mask[0][uVar53];
          }
          else {
            uVar37 = 1 << ((char)uVar51 * '\x03' + (char)uVar53 & 0x1fU);
          }
          uVar37 = uVar37 & 0x1fe;
          uVar23 = 0;
          goto LAB_003c1684;
        }
      }
      if ((0x10003UL >> ((ulong)tile_data_00 & 0x3f) & 1) == 0) {
        piVar19 = (int *)(ulong)uVar52;
      }
      ppBVar50 = (BUFFER_SET **)0x0;
      dst_bufs = (BUFFER_SET **)0x3;
      do {
        uVar37 = (int)dst_bufs - 1;
        dst_bufs = (BUFFER_SET **)(ulong)uVar37;
        iVar20 = interpolation_filter_rd
                           (x,cpi,tile_data_00,bsize_00,(BUFFER_SET *)rd,(int64_t *)&local_b0,
                            &local_d8,(RD_STATS *)switchable_rate,(int *)&local_e8,dst_bufs,
                            (int)switchable_ctx,piVar19,in_stack_fffffffffffffe58);
        if (iVar20 != 0) {
          ppBVar50 = dst_bufs;
        }
        piVar19 = (int *)(ulong)uVar52;
      } while (1 < uVar37);
      piVar19 = piVar17;
      if ((0x20005UL >> ((ulong)tile_data_00 & 0x3f) & 1) != 0) {
        piVar19 = (int *)(ulong)(uint)(cpi->interp_search_flags).default_interp_skip_flags;
      }
      uVar37 = (int)ppBVar50 + 6;
      do {
        interpolation_filter_rd
                  (x,cpi,tile_data_00,bsize_00,(BUFFER_SET *)rd,(int64_t *)&local_b0,&local_d8,
                   (RD_STATS *)switchable_rate,(int *)&local_e8,(BUFFER_SET **)(ulong)uVar37,
                   (int)switchable_ctx,piVar19,in_stack_fffffffffffffe58);
        uVar37 = uVar37 - 3;
        piVar19 = piVar17;
      } while ((int)ppBVar50 + 3 <= (int)uVar37);
      goto LAB_003c1690;
    }
    piVar36 = (int *)(ulong)(uVar37 & uVar52);
    uVar23 = 0;
    uVar37 = 0x1fe;
  }
LAB_003c1684:
  find_best_interp_rd_facade
            (x,cpi,tile_data_00,bsize_00,(BUFFER_SET *)rd,(int64_t *)&local_b0,&local_d8,
             (RD_STATS *)switchable_rate,(int *)&local_e8,(BUFFER_SET **)switchable_ctx,piVar36,
             uVar37,uVar23,iVar34);
LAB_003c1690:
  local_108[0] = *(undefined8 *)(local_e0->stride + 2);
  puStack_118 = local_e0->plane[2];
  uStack_110 = *(ulong *)local_e0->stride;
  local_128 = local_e0->plane[0];
  puStack_120 = local_e0->plane[1];
  pmVar11 = (x->e_mbd).plane;
  lVar49 = 0;
  do {
    pbVar18 = &pmVar11->dst;
    pbVar18->buf = (uint8_t *)(&local_128)[lVar49];
    pbVar18->stride = *(int *)((long)local_108 + lVar49 * 4 + -8);
    lVar49 = lVar49 + 1;
    pmVar11 = (macroblockd_plane *)(pbVar18 + 0x51);
  } while (lVar16 != lVar49);
  if (x->recalc_luma_mc_data == 1) {
    av1_enc_build_inter_predictor
              (local_60,xd,(x->e_mbd).mi_row,(x->e_mbd).mi_col,orig_dst,bsize_01,0,0);
  }
  uVar37 = (uint)(local_98 >> 4);
  x->pred_sse[local_88] = uVar37;
  if ((cpi->sf).interp_sf.use_interp_filter != 0) {
    iVar15 = args->interp_filter_stats_idx;
    lVar16 = (long)iVar15;
    if (lVar16 < 0x80) {
      iVar20 = *rd;
      uVar5 = *(undefined2 *)pMVar6->ref_frame;
      CVar4 = (pMVar6->interinter_comp).type;
      uVar14 = *(ushort *)&pMVar6->field_0xa7;
      uVar44 = *(undefined8 *)pMVar6->mv;
      args->interp_filter_stats[lVar16].filters = pMVar6->interp_filters;
      *(undefined8 *)args->interp_filter_stats[lVar16].mv = uVar44;
      *(undefined2 *)args->interp_filter_stats[lVar16].ref_frames = uVar5;
      args->interp_filter_stats[lVar16].comp_type = CVar4;
      args->interp_filter_stats[lVar16].compound_idx = uVar14 >> 9 & 1;
      args->interp_filter_stats[lVar16].rd = iVar20;
      args->interp_filter_stats[lVar16].pred_sse = uVar37;
      iVar15 = iVar15 + 1;
    }
    args->interp_filter_stats_idx = iVar15;
  }
  return 0;
}

Assistant:

int64_t av1_interpolation_filter_search(
    MACROBLOCK *const x, const AV1_COMP *const cpi,
    const TileDataEnc *tile_data, BLOCK_SIZE bsize,
    const BUFFER_SET *const tmp_dst, const BUFFER_SET *const orig_dst,
    int64_t *const rd, int *const switchable_rate, int *skip_build_pred,
    HandleInterModeArgs *args, int64_t ref_best_rd) {
  const AV1_COMMON *cm = &cpi->common;
  const InterpSearchFlags *interp_search_flags = &cpi->interp_search_flags;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int need_search = av1_is_interp_needed(xd);
  const int ref_frame = xd->mi[0]->ref_frame[0];
  RD_STATS rd_stats_luma, rd_stats;

  // Initialization of rd_stats structures with default values
  av1_init_rd_stats(&rd_stats_luma);
  av1_init_rd_stats(&rd_stats);

  int match_found_idx = -1;
  const InterpFilter assign_filter = cm->features.interp_filter;

  match_found_idx = find_interp_filter_match(
      mbmi, cpi, assign_filter, need_search, args->interp_filter_stats,
      args->interp_filter_stats_idx);

  if (match_found_idx != -1) {
    *rd = args->interp_filter_stats[match_found_idx].rd;
    x->pred_sse[ref_frame] =
        args->interp_filter_stats[match_found_idx].pred_sse;
    *skip_build_pred = 0;
    return 0;
  }

  int switchable_ctx[2];
  switchable_ctx[0] = av1_get_pred_context_switchable_interp(xd, 0);
  switchable_ctx[1] = av1_get_pred_context_switchable_interp(xd, 1);
  *switchable_rate =
      get_switchable_rate(x, mbmi->interp_filters, switchable_ctx,
                          cm->seq_params->enable_dual_filter);

  // Do MC evaluation for default filter_type.
  // Luma MC
  interp_model_rd_eval(x, cpi, bsize, orig_dst, AOM_PLANE_Y, AOM_PLANE_Y,
                       &rd_stats_luma, *skip_build_pred);

#if CONFIG_COLLECT_RD_STATS == 3
  RD_STATS rd_stats_y;
  av1_pick_recursive_tx_size_type_yrd(cpi, x, &rd_stats_y, bsize, INT64_MAX);
  PrintPredictionUnitStats(cpi, tile_data, x, &rd_stats_y, bsize);
#endif  // CONFIG_COLLECT_RD_STATS == 3
  // Chroma MC
  if (num_planes > 1) {
    interp_model_rd_eval(x, cpi, bsize, orig_dst, AOM_PLANE_U, AOM_PLANE_V,
                         &rd_stats, *skip_build_pred);
  }
  *skip_build_pred = 1;

  av1_merge_rd_stats(&rd_stats, &rd_stats_luma);

  assert(rd_stats.rate >= 0);

  *rd = RDCOST(x->rdmult, *switchable_rate + rd_stats.rate, rd_stats.dist);
  x->pred_sse[ref_frame] = (unsigned int)(rd_stats_luma.sse >> 4);

  if (assign_filter != SWITCHABLE || match_found_idx != -1) {
    return 0;
  }
  if (!need_search) {
    int_interpfilters filters = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
    assert(mbmi->interp_filters.as_int == filters.as_int);
    (void)filters;
    return 0;
  }
  if (args->modelled_rd != NULL) {
    if (has_second_ref(mbmi)) {
      const int ref_mv_idx = mbmi->ref_mv_idx;
      MV_REFERENCE_FRAME *refs = mbmi->ref_frame;
      const int mode0 = compound_ref0_mode(mbmi->mode);
      const int mode1 = compound_ref1_mode(mbmi->mode);
      const int64_t mrd = AOMMIN(args->modelled_rd[mode0][ref_mv_idx][refs[0]],
                                 args->modelled_rd[mode1][ref_mv_idx][refs[1]]);
      if ((*rd >> 1) > mrd && ref_best_rd < INT64_MAX) {
        return INT64_MAX;
      }
    }
  }

  x->recalc_luma_mc_data = 0;
  // skip_flag=xx (in binary form)
  // Setting 0th flag corresonds to skipping luma MC and setting 1st bt
  // corresponds to skipping chroma MC  skip_flag=0 corresponds to "Don't skip
  // luma and chroma MC"  Skip flag=1 corresponds to "Skip Luma MC only"
  // Skip_flag=2 is not a valid case
  // skip_flag=3 corresponds to "Skip both luma and chroma MC"
  int skip_hor = interp_search_flags->default_interp_skip_flags;
  int skip_ver = interp_search_flags->default_interp_skip_flags;
  calc_interp_skip_pred_flag(x, cpi, &skip_hor, &skip_ver);

  // do interp_filter search
  restore_dst_buf(xd, *tmp_dst, num_planes);
  const BUFFER_SET *dst_bufs[2] = { tmp_dst, orig_dst };
  // Evaluate dual interp filters
  if (cm->seq_params->enable_dual_filter) {
    if (cpi->sf.interp_sf.use_fast_interpolation_filter_search) {
      fast_dual_interp_filter_rd(x, cpi, tile_data, bsize, orig_dst, rd,
                                 &rd_stats_luma, &rd_stats, switchable_rate,
                                 dst_bufs, switchable_ctx, skip_hor, skip_ver);
    } else {
      // Use full interpolation filter search
      uint16_t allowed_interp_mask = ALLOW_ALL_INTERP_FILT_MASK;
      // REG_REG filter type is evaluated beforehand, so loop is repeated over
      // REG_SMOOTH to SHARP_SHARP for full interpolation filter search
      reset_interp_filter_allowed_mask(&allowed_interp_mask, REG_REG);
      find_best_interp_rd_facade(x, cpi, tile_data, bsize, orig_dst, rd,
                                 &rd_stats_luma, &rd_stats, switchable_rate,
                                 dst_bufs, switchable_ctx,
                                 (skip_hor & skip_ver), allowed_interp_mask, 0);
    }
  } else {
    // Evaluate non-dual interp filters
    find_best_non_dual_interp_filter(
        x, cpi, tile_data, bsize, orig_dst, rd, &rd_stats_luma, &rd_stats,
        switchable_rate, dst_bufs, switchable_ctx, skip_ver, skip_hor);
  }
  swap_dst_buf(xd, dst_bufs, num_planes);
  // Recompute final MC data if required
  if (x->recalc_luma_mc_data == 1) {
    // Recomputing final luma MC data is required only if the same was skipped
    // in either of the directions  Condition below is necessary, but not
    // sufficient
    assert((skip_hor == 1) || (skip_ver == 1));
    const int mi_row = xd->mi_row;
    const int mi_col = xd->mi_col;
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                  AOM_PLANE_Y, AOM_PLANE_Y);
  }
  x->pred_sse[ref_frame] = (unsigned int)(rd_stats_luma.sse >> 4);

  // save search results
  if (cpi->sf.interp_sf.use_interp_filter) {
    assert(match_found_idx == -1);
    args->interp_filter_stats_idx = save_interp_filter_search_stat(
        mbmi, *rd, x->pred_sse[ref_frame], args->interp_filter_stats,
        args->interp_filter_stats_idx);
  }
  return 0;
}